

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos-op.c
# Opt level: O3

int dos_get_volume_label(hd_context *ctx,dos_disk *disk)

{
  byte bVar1;
  uint uVar2;
  uchar *puVar3;
  long lVar4;
  byte bVar5;
  
  puVar3 = disk->first_sector;
  lVar4 = 0;
  bVar5 = 0;
  do {
    bVar1 = puVar3[lVar4 + 0x1c2];
    if (bVar1 < 0xf) {
      if ((bVar1 != 0) && (bVar1 != 5)) {
LAB_00102091:
        if ((*(short *)(puVar3 + 0x1fe) == -0x55ab) && ((puVar3[lVar4 + 0x1be] & 0x7f) == 0)) {
          uVar2 = *(uint *)(puVar3 + lVar4 + 0x1ca);
joined_r0x0010208d:
          if (uVar2 - 0x40 < 0xfffffec0) {
            (disk->super).volume[bVar5].beginsector = (ulong)*(uint *)(puVar3 + lVar4 + 0x1c6);
            (disk->super).volume[bVar5].partition_info_sector = 0;
            (disk->super).volume[bVar5].total_sectors = (ulong)uVar2;
            bVar5 = bVar5 + 1;
          }
        }
      }
    }
    else if (bVar1 != 0xf) {
      if (bVar1 != 0x42) goto LAB_00102091;
      if ((puVar3[lVar4 + 0x1be] & 0x7f) == 0) {
        uVar2 = *(uint *)(puVar3 + lVar4 + 0x1ca);
        goto joined_r0x0010208d;
      }
    }
    lVar4 = lVar4 + 0x10;
    if (lVar4 == 0x40) {
      return (int)bVar5;
    }
  } while( true );
}

Assistant:

int dos_get_volume_label(hd_context *ctx, dos_disk *disk)
{
    com_mbr *mbr = (com_mbr *)disk->first_sector;

    uint8_t ret,curpart;
    curpart = 0;

    int i;
    for (i = 0; i < 4; i++)
    {
        ret = 0;
        if ( mbr->partition[i].pid == 0x05 || mbr->partition[i].pid == 0x0f )
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
        } else if (mbr->partition[i].pid == 0x42)
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
            else
            {
                if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                    curpart++;
            }
        } else if (mbr->partition[i].pid != 0 && mbr->byEnding == 0xAA55)
        {
            if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                curpart++;
        }
    }

    return curpart;
}